

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arith_routines_logist.c
# Opt level: O1

int WebRtcIsac_EncLogisticMulti2
              (Bitstr *streamdata,int16_t *dataQ7,uint16_t *envQ8,int N,int16_t isSWB12kHz)

{
  uint32_t *puVar1;
  uint8_t uVar2;
  short sVar3;
  ulong uVar4;
  uint uVar5;
  uint8_t *puVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  bool bVar14;
  
  uVar9 = streamdata->W_upper;
  uVar4 = (ulong)streamdata->stream_index;
  if (0 < N) {
    uVar11 = 0;
    do {
      iVar7 = (*dataQ7 + -0x40) * (uint)*envQ8;
      if (iVar7 < -0x4ffff) {
        iVar7 = -0x50000;
      }
      if (0x4ffff < iVar7) {
        iVar7 = 0x50000;
      }
      uVar10 = iVar7 * 5 + 0x190000U >> 0x10;
      iVar8 = (iVar7 - kHistEdgesQ15[uVar10]) * kCdfSlopeQ0[uVar10] >> 0xf;
      iVar7 = (*dataQ7 + 0x40) * (uint)*envQ8;
      if (iVar7 < -0x4ffff) {
        iVar7 = -0x50000;
      }
      if (0x4ffff < iVar7) {
        iVar7 = 0x50000;
      }
      uVar5 = iVar7 * 5 + 0x190000U >> 0x10;
      uVar13 = kCdfQ16[uVar10] + iVar8;
      uVar12 = ((iVar7 - kHistEdgesQ15[uVar5]) * kCdfSlopeQ0[uVar5] >> 0xf) + kCdfQ16[uVar5];
      uVar5 = uVar13;
      if (uVar12 <= kCdfQ16[uVar10] + iVar8 + 1U) {
        do {
          sVar3 = *dataQ7;
          if (sVar3 < 1) {
            *dataQ7 = sVar3 + 0x80;
            iVar7 = (uint)*envQ8 * ((short)(sVar3 + 0x80) + 0x40);
            if (iVar7 < -0x4ffff) {
              iVar7 = -0x50000;
            }
            if (0x4ffff < iVar7) {
              iVar7 = 0x50000;
            }
            uVar10 = iVar7 * 5 + 0x190000U >> 0x10;
            uVar13 = uVar12;
            uVar12 = ((iVar7 - kHistEdgesQ15[uVar10]) * kCdfSlopeQ0[uVar10] >> 0xf) +
                     kCdfQ16[uVar10];
          }
          else {
            *dataQ7 = sVar3 + -0x80;
            iVar7 = (uint)*envQ8 * (sVar3 + -0xc0);
            if (iVar7 < -0x4ffff) {
              iVar7 = -0x50000;
            }
            if (0x4ffff < iVar7) {
              iVar7 = 0x50000;
            }
            uVar10 = iVar7 * 5 + 0x190000U >> 0x10;
            uVar13 = ((iVar7 - kHistEdgesQ15[uVar10]) * kCdfSlopeQ0[uVar10] >> 0xf) +
                     kCdfQ16[uVar10];
            uVar12 = uVar5;
          }
          uVar5 = uVar13;
        } while (uVar12 <= uVar13 + 1);
      }
      uVar13 = (uVar13 * (uVar9 & 0xffff) >> 0x10) + uVar13 * (uVar9 >> 0x10) + 1;
      puVar1 = &streamdata->streamval;
      uVar10 = *puVar1;
      *puVar1 = *puVar1 + uVar13;
      if (CARRY4(uVar10,uVar13)) {
        puVar6 = streamdata->stream + (uVar4 - 1);
        do {
          *puVar6 = *puVar6 + '\x01';
          uVar2 = *puVar6;
          puVar6 = puVar6 + -1;
        } while (uVar2 == '\0');
      }
      uVar9 = (((uVar9 & 0xffff) * uVar12 >> 0x10) + (uVar9 >> 0x10) * uVar12) - uVar13;
      uVar10 = uVar9;
      if (uVar9 < 0x1000000) {
        do {
          streamdata->stream[uVar4] = *(uint8_t *)((long)&streamdata->streamval + 3);
          if (0x18e < (long)uVar4) {
            return -0x1928;
          }
          uVar4 = uVar4 + 1;
          streamdata->streamval = streamdata->streamval << 8;
          uVar9 = uVar10 << 8;
          bVar14 = uVar10 < 0x10000;
          uVar10 = uVar9;
        } while (bVar14);
      }
      dataQ7 = dataQ7 + 1;
      envQ8 = envQ8 + ((-(uint)(isSWB12kHz != 0) | uVar11 >> 1) & uVar11 & 1);
      uVar11 = uVar11 + 1;
    } while (uVar11 != N);
  }
  streamdata->stream_index = (uint32_t)uVar4;
  streamdata->W_upper = uVar9;
  return 0;
}

Assistant:

int WebRtcIsac_EncLogisticMulti2(
    Bitstr *streamdata,      /* in-/output struct containing bitstream */
    int16_t *dataQ7,    /* input: data vector */
    const uint16_t *envQ8, /* input: side info vector defining the width of the pdf */
    const int N,       /* input: data vector length / 2 */
    const int16_t isSWB12kHz)
{
  uint32_t W_lower, W_upper;
  uint32_t W_upper_LSB, W_upper_MSB;
  uint8_t *stream_ptr;
  uint8_t *maxStreamPtr;
  uint8_t *stream_ptr_carry;
  uint32_t cdf_lo, cdf_hi;
  int k;

  /* point to beginning of stream buffer */
  stream_ptr = streamdata->stream + streamdata->stream_index;
  W_upper = streamdata->W_upper;

  maxStreamPtr = streamdata->stream + STREAM_SIZE_MAX_60 - 1;
  for (k = 0; k < N; k++)
  {
    /* compute cdf_lower and cdf_upper by evaluating the piecewise linear cdf */
    cdf_lo = piecewise((*dataQ7 - 64) * *envQ8);
    cdf_hi = piecewise((*dataQ7 + 64) * *envQ8);

    /* test and clip if probability gets too small */
    while (cdf_lo+1 >= cdf_hi) {
      /* clip */
      if (*dataQ7 > 0) {
        *dataQ7 -= 128;
        cdf_hi = cdf_lo;
        cdf_lo = piecewise((*dataQ7 - 64) * *envQ8);
      } else {
        *dataQ7 += 128;
        cdf_lo = cdf_hi;
        cdf_hi = piecewise((*dataQ7 + 64) * *envQ8);
      }
    }

    dataQ7++;
    // increment only once per 4 iterations for SWB-16kHz or WB
    // increment only once per 2 iterations for SWB-12kHz
    envQ8 += (isSWB12kHz)? (k & 1):((k & 1) & (k >> 1));


    /* update interval */
    W_upper_LSB = W_upper & 0x0000FFFF;
    W_upper_MSB = W_upper >> 16;
    W_lower = W_upper_MSB * cdf_lo;
    W_lower += (W_upper_LSB * cdf_lo) >> 16;
    W_upper = W_upper_MSB * cdf_hi;
    W_upper += (W_upper_LSB * cdf_hi) >> 16;

    /* shift interval such that it begins at zero */
    W_upper -= ++W_lower;

    /* add integer to bitstream */
    streamdata->streamval += W_lower;

    /* handle carry */
    if (streamdata->streamval < W_lower)
    {
      /* propagate carry */
      stream_ptr_carry = stream_ptr;
      while (!(++(*--stream_ptr_carry)));
    }

    /* renormalize interval, store most significant byte of streamval and update streamval */
    while ( !(W_upper & 0xFF000000) )      /* W_upper < 2^24 */
    {
      W_upper <<= 8;
      *stream_ptr++ = (uint8_t) (streamdata->streamval >> 24);

      if(stream_ptr > maxStreamPtr)
      {
        return -ISAC_DISALLOWED_BITSTREAM_LENGTH;
      }
      streamdata->streamval <<= 8;
    }
  }

  /* calculate new stream_index */
  streamdata->stream_index = (int)(stream_ptr - streamdata->stream);
  streamdata->W_upper = W_upper;

  return 0;
}